

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_equal.c
# Opt level: O0

_Bool run_container_equals_bitset(run_container_t *container1,bitset_container_t *container2)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  int *in_RSI;
  int *in_RDI;
  uint32_t end;
  uint32_t begin;
  int32_t i;
  int bitset_card;
  int run_card;
  uint32_t in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffcc;
  uint16_t in_stack_ffffffffffffffce;
  int in_stack_ffffffffffffffd4;
  int local_24;
  _Bool local_1;
  
  iVar2 = run_container_cardinality
                    ((run_container_t *)
                     CONCAT26(in_stack_ffffffffffffffce,
                              CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)));
  if (*in_RSI == -1) {
    iVar3 = bitset_container_compute_cardinality
                      ((bitset_container_t *)
                       CONCAT26(in_stack_ffffffffffffffce,
                                CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)));
  }
  else {
    iVar3 = *in_RSI;
  }
  if (iVar3 == iVar2) {
    for (local_24 = 0; local_24 < *in_RDI; local_24 = local_24 + 1) {
      if (*(short *)(*(long *)(in_RDI + 2) + 2 + (long)local_24 * 4) == 0) {
        _Var1 = bitset_container_contains
                          ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffffd4,iVar3),
                           in_stack_ffffffffffffffce);
        if (!_Var1) {
          return false;
        }
      }
      else {
        in_stack_ffffffffffffffd4 =
             (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)local_24 * 4) +
             (uint)*(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_24 * 4) + 1;
        _Var1 = bitset_container_contains_range
                          ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffffd4,iVar3),
                           CONCAT22(in_stack_ffffffffffffffce,in_stack_ffffffffffffffcc),
                           in_stack_ffffffffffffffc8);
        if (!_Var1) {
          return false;
        }
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool run_container_equals_bitset(const run_container_t* container1,
                                 const bitset_container_t* container2) {
    int run_card = run_container_cardinality(container1);
    int bitset_card = (container2->cardinality != BITSET_UNKNOWN_CARDINALITY)
                          ? container2->cardinality
                          : bitset_container_compute_cardinality(container2);
    if (bitset_card != run_card) {
        return false;
    }

    for (int32_t i = 0; i < container1->n_runs; i++) {
        uint32_t begin = container1->runs[i].value;
        if (container1->runs[i].length) {
            uint32_t end = begin + container1->runs[i].length + 1;
            if (!bitset_container_contains_range(container2, begin, end)) {
                return false;
            }
        } else {
            if (!bitset_container_contains(container2, begin)) {
                return false;
            }
        }
    }

    return true;
}